

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inputs.cpp
# Opt level: O2

double helics::doubleExtractAndConvert
                 (data_view *dv,shared_ptr<units::precise_unit> *inputUnits,
                 shared_ptr<units::precise_unit> *outputUnits)

{
  precise_unit *start;
  precise_unit *result;
  double dVar1;
  
  dVar1 = ValueConverter<double>::interpret(dv);
  start = (inputUnits->super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if ((start != (precise_unit *)0x0) &&
     (result = (outputUnits->super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr, result != (precise_unit *)0x0)) {
    dVar1 = ::units::convert<units::precise_unit,units::precise_unit>(dVar1,start,result);
    return dVar1;
  }
  return dVar1;
}

Assistant:

double doubleExtractAndConvert(const data_view& dv,
                               const std::shared_ptr<units::precise_unit>& inputUnits,
                               const std::shared_ptr<units::precise_unit>& outputUnits)
{
    auto V = ValueConverter<double>::interpret(dv);
    if ((inputUnits) && (outputUnits)) {
        V = units::convert(V, *inputUnits, *outputUnits);
    }
    return V;
}